

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileutils.c
# Opt level: O2

void write_local_cert(scep *s)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  X509 *a;
  X509_NAME *pXVar4;
  char *pcVar5;
  char *pcVar6;
  X509_NAME *pXVar7;
  FILE *pFVar8;
  int iVar9;
  char buffer [1024];
  char local_c38 [1024];
  char cert_buf [1024];
  char buffer_1 [1024];
  
  localcert = (X509 *)0x0;
  lVar1 = ((s->reply_p7->d).data)->flags;
  if (v_flag != 0) {
    uVar2 = OPENSSL_sk_num(lVar1);
    printf("write_local_cert(): found %d cert(s)\n",(ulong)uVar2);
  }
  for (iVar9 = 0; iVar3 = OPENSSL_sk_num(lVar1), a = (X509 *)localcert, iVar9 < iVar3;
      iVar9 = iVar9 + 1) {
    a = (X509 *)OPENSSL_sk_value(lVar1,iVar9);
    pcVar6 = pname;
    if (v_flag != 0) {
      pXVar4 = X509_get_subject_name(a);
      pcVar5 = X509_NAME_oneline(pXVar4,buffer,0x400);
      printf("%s: found certificate with\n  subject: \'%s\'\n",pcVar6,pcVar5);
      pXVar4 = X509_get_issuer_name(a);
      pcVar6 = X509_NAME_oneline(pXVar4,buffer,0x400);
      printf("  issuer: %s\n",pcVar6);
      pXVar4 = (X509_NAME *)X509_REQ_get_subject_name(request);
      pcVar6 = X509_NAME_oneline(pXVar4,buffer,0x400);
      printf("  request_subject: \'%s\'\n",pcVar6);
    }
    pXVar4 = X509_get_subject_name(a);
    pXVar7 = (X509_NAME *)X509_REQ_get_subject_name(request);
    iVar3 = X509_NAME_cmp(pXVar4,pXVar7);
    pFVar8 = _stderr;
    if (d_flag != 0) {
      pXVar4 = X509_get_subject_name(a);
      pcVar6 = X509_NAME_oneline(pXVar4,(char *)0x0,0);
      fprintf(pFVar8,"Subject of the returned certificate: %s\n",pcVar6);
      pFVar8 = _stderr;
      pXVar4 = (X509_NAME *)X509_REQ_get_subject_name(request);
      pcVar6 = X509_NAME_oneline(pXVar4,buffer_1,0x400);
      fprintf(pFVar8,"Subject of the request: %s\n",pcVar6);
    }
    if (iVar3 == 0) {
LAB_0010ca81:
      if (v_flag != 0) {
        puts("CN\'s of request and certificate matched!");
      }
    }
    else {
      pXVar4 = X509_get_subject_name(a);
      X509_NAME_oneline(pXVar4,cert_buf,0x400);
      pXVar4 = (X509_NAME *)X509_REQ_get_subject_name(request);
      X509_NAME_oneline(pXVar4,local_c38,0x400);
      if (v_flag != 0) {
        printf(" X509_NAME_cmp() workaround: strcmp request subject (%s) to cert subject (%s)\n",
               local_c38,cert_buf);
      }
      iVar3 = strcmp(cert_buf,local_c38);
      if (iVar3 == 0) goto LAB_0010ca81;
      fprintf(_stderr,
              "%s: Subject of our request does not match that of the returned Certificate!\n",pname)
      ;
    }
    pXVar4 = X509_get_subject_name(a);
    pXVar7 = X509_get_issuer_name(a);
    iVar3 = X509_NAME_cmp(pXVar4,pXVar7);
    if (iVar3 != 0) break;
  }
  localcert = (X509 *)a;
  if (localcert == (X509 *)0x0) {
    pcVar6 = "%s: cannot find requested certificate\n";
  }
  else {
    pFVar8 = fopen(l_char,"w");
    if (pFVar8 != (FILE *)0x0) {
      if (v_flag != 0) {
        printf("%s: certificate written as %s\n",pname,l_char);
      }
      if (d_flag != 0) {
        PEM_write_X509(_stdout,(X509 *)localcert);
      }
      iVar9 = PEM_write_X509(pFVar8,(X509 *)localcert);
      if (iVar9 == 1) {
        fclose(pFVar8);
        return;
      }
      fprintf(_stderr,"%s: error while writing certificate file\n",pname);
      ERR_print_errors_fp(_stderr);
      goto LAB_0010cc78;
    }
    pcVar6 = "%s: cannot open cert file for writing\n";
  }
  fprintf(_stderr,pcVar6,pname);
LAB_0010cc78:
  exit(0x5d);
}

Assistant:

void
write_local_cert(struct scep *s) {
	PKCS7			*p7;
	STACK_OF(X509)		*certs;
	X509			*cert = NULL;
	FILE			*fp;
	int			i;

	localcert = NULL;

	/* Get certs */
	p7 = s->reply_p7;
	certs = p7->d.sign->cert;
       
        if (v_flag) {
		printf ("write_local_cert(): found %d cert(s)\n", sk_X509_num(certs));
        }

	/* Find cert */
	for (i = 0; i < sk_X509_num(certs); i++) {
		char buffer[1024];
		cert = sk_X509_value(certs, i);
		if (v_flag) {
			printf("%s: found certificate with\n"
				"  subject: '%s'\n", pname,
				X509_NAME_oneline(X509_get_subject_name(cert),
					buffer, sizeof(buffer)));
			printf("  issuer: %s\n", 
				X509_NAME_oneline(X509_get_issuer_name(cert),
					buffer, sizeof(buffer)));
			printf("  request_subject: '%s'\n", 
				X509_NAME_oneline(X509_REQ_get_subject_name(request),
                                        buffer, sizeof(buffer)));
		}
		/* The subject has to match that of our request */
		if (!compare_subject(cert)) {
			
			if (v_flag)
				printf ("CN's of request and certificate matched!\n");
		} else {
			fprintf(stderr, "%s: Subject of our request does not match that of the returned Certificate!\n", pname);
			//exit (SCEP_PKISTATUS_FILE);
		}
		
		/* The subject cannot be the issuer (selfsigned) */
		if (X509_NAME_cmp(X509_get_subject_name(cert),
			X509_get_issuer_name(cert))) {
				localcert = cert;
				break;
		}
	}
	if (localcert == NULL) {
		fprintf(stderr, "%s: cannot find requested certificate\n",
				pname);
		exit (SCEP_PKISTATUS_FILE);

	}
	/* Write PEM-formatted file: */
#ifdef WIN32
	if ((fopen_s(&fp, l_char, "w")))
#else
	if (!(fp = fopen(l_char, "w")))
#endif
	{
		fprintf(stderr, "%s: cannot open cert file for writing\n",
				pname);
		exit (SCEP_PKISTATUS_FILE);
	}
	if (v_flag)
		printf("%s: certificate written as %s\n", pname, l_char);
	if (d_flag)
		PEM_write_X509(stdout, localcert);
	if (PEM_write_X509(fp, localcert) != 1) {
		fprintf(stderr, "%s: error while writing certificate "
			"file\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_FILE);
	}
	(void)fclose(fp);
}